

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pTextureUploadTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles2::Performance::TextureUploadCallCase::iterate(TextureUploadCallCase *this)

{
  TheilSenCalibrator *this_00;
  qpWatchDog *dog;
  int iVar1;
  State SVar2;
  deUint32 err;
  undefined4 extraout_var;
  deUint64 dVar3;
  deUint64 dVar4;
  int iVar5;
  bool bVar6;
  
  iVar1 = (*((this->super_TextureUploadCase).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  if (((this->super_TextureUploadCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
      m_testResult == QP_TEST_RESULT_NOT_SUPPORTED) {
    return STOP;
  }
  this_00 = &(this->super_TextureUploadCase).m_calibrator;
  do {
    SVar2 = deqp::gls::TheilSenCalibrator::getState(this_00);
    if (SVar2 == STATE_RECOMPUTE_PARAMS) {
      deqp::gls::TheilSenCalibrator::recomputeParameters(this_00);
    }
    else {
      if (SVar2 != STATE_MEASURE) {
        err = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
        glu::checkError(err,"iterate",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/performance/es2pTextureUploadTests.cpp"
                        ,0x177);
        TextureUploadCase::logResults(&this->super_TextureUploadCase);
        return STOP;
      }
      iVar5 = (this->super_TextureUploadCase).m_calibrator.m_measureState.numDrawCalls;
      dVar3 = deGetMicroseconds();
      if (iVar5 < 1) {
        iVar5 = 0;
      }
      while (bVar6 = iVar5 != 0, iVar5 = iVar5 + -1, bVar6) {
        render(this);
      }
      (**(code **)(CONCAT44(extraout_var,iVar1) + 0x648))();
      dVar4 = deGetMicroseconds();
      deqp::gls::TheilSenCalibrator::recordIteration(this_00,dVar4 - dVar3);
    }
    dog = ((this->super_TextureUploadCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
          m_watchDog;
    if (dog != (qpWatchDog *)0x0) {
      qpWatchDog_touch(dog);
    }
  } while( true );
}

Assistant:

tcu::TestNode::IterateResult TextureUploadCallCase::iterate (void)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	if (m_testCtx.getTestResult() == QP_TEST_RESULT_NOT_SUPPORTED)
		return STOP;

	for (;;)
	{
		gls::TheilSenCalibrator::State state = m_calibrator.getState();

		if (state == gls::TheilSenCalibrator::STATE_MEASURE)
		{
			int			numCalls	= m_calibrator.getCallCount();
			deUint64	startTime	= deGetMicroseconds();

			for (int i = 0; i < numCalls; i++)
				render();

			gl.finish();

			deUint64	endTime		= deGetMicroseconds();
			deUint64	duration	= endTime-startTime;

			m_calibrator.recordIteration(duration);
		}
		else if (state == gls::TheilSenCalibrator::STATE_RECOMPUTE_PARAMS)
		{
			m_calibrator.recomputeParameters();
		}
		else
		{
			DE_ASSERT(state == gls::TheilSenCalibrator::STATE_FINISHED);
			break;
		}

		// Touch watchdog between iterations to avoid timeout.
		{
			qpWatchDog* dog = m_testCtx.getWatchDog();
			if (dog)
				qpWatchDog_touch(dog);
		}
	}

	GLU_EXPECT_NO_ERROR(gl.getError(), "iterate");
	logResults();
	return STOP;
}